

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionObservationHistoryTree.cpp
# Opt level: O0

void __thiscall
ActionObservationHistoryTree::SetSuccessor
          (ActionObservationHistoryTree *this,Index aI,Index oI,ActionObservationHistoryTree *suc)

{
  bool bVar1;
  undefined8 uVar2;
  void *pvVar3;
  char *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  ActionObservationHistoryTree *oNode;
  TreeNode<ActionObservationHistory> *in_stack_000001c0;
  LIndex in_stack_000001c8;
  TreeNode<ActionObservationHistory> *in_stack_000001d0;
  ActionObservationHistoryTree *in_stack_ffffffffffffffc0;
  LIndex in_stack_ffffffffffffffd0;
  TreeNode<ActionObservationHistory> *in_stack_ffffffffffffffd8;
  
  if (*(int *)(in_RDI + 0x58) == 1) {
    uVar2 = __cxa_allocate_exception(0x28);
    E::E((E *)CONCAT44(in_ESI,in_EDX),in_RCX);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  bVar1 = TreeNode<ActionObservationHistory>::ExistsSuccessor
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (bVar1) {
    TreeNode<ActionObservationHistory>::GetSuccessor
              ((TreeNode<ActionObservationHistory> *)CONCAT44(in_ESI,in_EDX),(LIndex)in_RCX);
  }
  else {
    pvVar3 = operator_new(0x60);
    ActionObservationHistoryTree(in_stack_ffffffffffffffc0,(aoh_t)((ulong)pvVar3 >> 0x20));
    TreeNode<ActionObservationHistory>::SetSuccessor
              (in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  }
  TreeNode<ActionObservationHistory>::SetSuccessor
            (in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  return;
}

Assistant:

void ActionObservationHistoryTree::SetSuccessor(Index aI, Index oI,
        ActionObservationHistoryTree* suc)
{
    if (_m_nodeType == O_SUC)
        throw E("Trying ActionObservationHistoryTree::SetSuccessor(Index aI, Index oI, ActionObservationHistoryTree* suc)  on O_SUC node");

    //first see if necessary to create a new  intermediate node
    ActionObservationHistoryTree* oNode; 
    if(this->TreeNode<ActionObservationHistory>::ExistsSuccessor(aI))
        oNode = (ActionObservationHistoryTree*)
            this->TreeNode<ActionObservationHistory>::GetSuccessor(aI);
    else //we need to create an intermediate node
    {
        oNode = new ActionObservationHistoryTree(O_SUC);

        //which is the aI'th successor of this node
        this->TreeNode<ActionObservationHistory>::SetSuccessor(aI, oNode);
    }

    //let oNode point to the actual successor.
    //Note: SetSuccessor with 1 index should give no problem for O_SUC nodes
    oNode->TreeNode<ActionObservationHistory>::SetSuccessor(oI, suc);
}